

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_buf.c
# Opt level: O3

ngx_chain_t * ngx_chain_get_free_buf(ngx_pool_t *p,ngx_chain_t **free)

{
  ngx_chain_t *pnVar1;
  ngx_buf_t *pnVar2;
  
  pnVar1 = *free;
  if (pnVar1 == (ngx_chain_t *)0x0) {
    pnVar1 = p->chain;
    if (pnVar1 == (ngx_chain_t *)0x0) {
      pnVar1 = (ngx_chain_t *)ngx_palloc(p,0x10);
      if (pnVar1 != (ngx_chain_t *)0x0) goto LAB_00115d73;
    }
    else {
      p->chain = pnVar1->next;
LAB_00115d73:
      pnVar2 = (ngx_buf_t *)ngx_pcalloc(p,0x50);
      pnVar1->buf = pnVar2;
      if (pnVar2 != (ngx_buf_t *)0x0) goto LAB_00115d88;
    }
    pnVar1 = (ngx_chain_t *)0x0;
  }
  else {
    *free = pnVar1->next;
LAB_00115d88:
    pnVar1->next = (ngx_chain_t *)0x0;
  }
  return pnVar1;
}

Assistant:

ngx_chain_t *
ngx_chain_get_free_buf(ngx_pool_t *p, ngx_chain_t **free)
{
    ngx_chain_t  *cl;

    if (*free) {
        cl = *free;
        *free = cl->next;
        cl->next = NULL;
        return cl;
    }

    cl = ngx_alloc_chain_link(p);
    if (cl == NULL) {
        return NULL;
    }

    cl->buf = ngx_calloc_buf(p);
    if (cl->buf == NULL) {
        return NULL;
    }

    cl->next = NULL;

    return cl;
}